

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O0

char * flatcc_json_parser_int8(flatcc_json_parser_t *ctx,char *buf,char *end,int8_t *v)

{
  char *mark;
  uint64_t uStack_38;
  int value_sign;
  uint64_t value;
  int8_t *v_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  uStack_38 = 0;
  mark._4_4_ = 0;
  *v = '\0';
  ctx_local = (flatcc_json_parser_t *)buf;
  if ((buf != end) &&
     (value = (uint64_t)v, v_local = end, end_local = buf, buf_local = (char *)ctx,
     end_local = flatcc_json_parser_integer
                           (ctx,buf,end,(int *)((long)&mark + 4),&stack0xffffffffffffffc8),
     ctx_local = (flatcc_json_parser_t *)end_local, end_local != buf)) {
    ctx_local = (flatcc_json_parser_t *)
                flatcc_json_parser_coerce_int8
                          ((flatcc_json_parser_t *)buf_local,end_local,v_local,mark._4_4_,uStack_38,
                           (int8_t *)value);
  }
  return (char *)ctx_local;
}

Assistant:

static inline const char *flatcc_json_parser_bool(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t *v)
{
    const char *k;
    uint8_t tmp;

    k = buf;
    if (end - buf >= 4 && memcmp(buf, "true", 4) == 0) {
        *v = 1;
        return k + 4;
    } else if (end - buf >= 5 && memcmp(buf, "false", 5) == 0) {
        *v = 0;
        return k + 5;
    }
    buf = flatcc_json_parser_uint8(ctx, buf, end, &tmp);
    *v = !!tmp;
    return buf;
}